

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  Mutex *this_00;
  RawBrandedSchema *pRVar1;
  int extraout_EAX;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar2;
  Fault f;
  RawBrandedSchema *mutableSchema;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> _kjCondition;
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  Fault local_80;
  RawBrandedSchema *local_78;
  RawBrandedSchema *local_70;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> local_68;
  Mutex *local_40;
  Mutex *local_38;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_30;
  
  local_78 = (RawBrandedSchema *)ctx;
  if (*(undefined8 **)(*(long *)ctx + 0x40) != (undefined8 *)0x0) {
    (**(code **)**(undefined8 **)(*(long *)ctx + 0x40))();
  }
  this_00 = (Mutex *)this->loader;
  local_68.left = (RawBrandedSchema **)((ulong)local_68.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(this_00);
  pRVar1 = local_78;
  local_38 = this_00 + 1;
  local_40 = this_00;
  if (local_78->lazyInitializer != (Initializer *)0x0) {
    local_68.left = (RawBrandedSchema **)local_78->generic;
    local_68.right = (RawBrandedSchema **)local_78->scopes;
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_80,(SchemaBindingsPair *)&this_00[1].waitersHead.ptr[3].exception.ptr.ptr);
    if (local_80.exception == (Exception *)0x0) {
      local_80.exception = (Exception *)0x0;
      local_68.left = (RawBrandedSchema **)0x0;
      local_68.right = (RawBrandedSchema **)0x0;
      kj::_::Debug::Fault::init
                (&local_80,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                );
      kj::_::Debug::Fault::fatal(&local_80);
    }
    local_70 = (RawBrandedSchema *)((local_80.exception)->ownFile).content.disposer;
    local_68.left = &local_70;
    local_68.right = &local_78;
    local_68.op.content.ptr = " == ";
    local_68.op.content.size_ = 5;
    local_68.result = local_70 == pRVar1;
    if (!local_68.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema*&,capnp::_::RawBrandedSchema_const*&>&>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x842,FAILED,"mutableSchema == schema","_kjCondition,",&local_68);
      kj::_::Debug::Fault::fatal(&local_80);
    }
    local_30.ptr.field_1.value.ptr = local_70->scopes;
    local_30.ptr.field_1.value.size_ = (size_t)local_70->scopeCount;
    local_30.ptr.isSet = true;
    AVar2 = Impl::makeBrandedDependencies
                      ((Impl *)this_00[1].waitersHead.ptr,local_70->generic,&local_30);
    local_70->dependencies = AVar2.ptr;
    local_70->dependencyCount = (uint32_t)AVar2.size_;
    local_70->lazyInitializer = (Initializer *)0x0;
  }
  kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
  return extraout_EAX;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__ || defined(__clang__)
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}